

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

ssize_t getPassword(uint8_t *prompt,uint8_t *line_buff,size_t buff_size,FILE *stream)

{
  int iVar1;
  __ssize_t _Var2;
  int local_ac;
  undefined1 local_a8 [4];
  int nread;
  termios new;
  termios old;
  FILE *stream_local;
  size_t buff_size_local;
  uint8_t *line_buff_local;
  uint8_t *prompt_local;
  
  stream_local = (FILE *)buff_size;
  buff_size_local = (size_t)line_buff;
  line_buff_local = prompt;
  if (prompt != (uint8_t *)0x0) {
    printf("%s\n",prompt);
  }
  iVar1 = fileno((FILE *)stream);
  iVar1 = tcgetattr(iVar1,(termios *)&new.c_ispeed);
  if (iVar1 == 0) {
    memcpy(local_a8,&new.c_ispeed,0x3c);
    new.c_oflag = new.c_oflag & 0xfffffff7;
    iVar1 = fileno((FILE *)stream);
    iVar1 = tcsetattr(iVar1,2,(termios *)local_a8);
    if (iVar1 == 0) {
      _Var2 = getline((char **)&buff_size_local,(size_t *)&stream_local,(FILE *)stream);
      local_ac = (int)_Var2;
      if ((0 < local_ac) && (*(char *)(buff_size_local + (long)(local_ac + -1)) == '\n')) {
        *(undefined1 *)(buff_size_local + (long)(local_ac + -1)) = 0;
        local_ac = local_ac + -1;
      }
      iVar1 = fileno((FILE *)stream);
      tcsetattr(iVar1,2,(termios *)&new.c_ispeed);
      prompt_local = (uint8_t *)(long)local_ac;
    }
    else {
      prompt_local = (uint8_t *)0xffffffffffffffff;
    }
  }
  else {
    prompt_local = (uint8_t *)0xffffffffffffffff;
  }
  return (ssize_t)prompt_local;
}

Assistant:

ssize_t getPassword(uint8_t* prompt, uint8_t* line_buff, size_t buff_size, FILE* stream)
{
    struct termios old, new;
    int nread = -1;

    /* Display the prompt */
    if (prompt != NULL) { printf("%s\n", prompt); }

    /* Turn off echoing and fail if we can't */
    if (tcgetattr(fileno(stream), &old) != 0) { return nread; }

    new = old;
    new.c_lflag &= ~ECHO;

    if (tcsetattr(fileno(stream), TCSAFLUSH, &new) != 0) { return nread; }

    /* Read the password. */
    nread = getline((char**)&line_buff, &buff_size, stream);

    /* Strip out the carriage return */
    if(nread >= 1 && line_buff[nread -1] == '\n')
    {
        line_buff[nread-1] = 0;
        nread--;
    }

    /* turn echo back on */
    (void)tcsetattr(fileno(stream), TCSAFLUSH, &old);

    return nread;
}